

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::javanano::FileGenerator::Generate(FileGenerator *this,Printer *printer)

{
  Params *pPVar1;
  const_iterator cVar2;
  FileDescriptor *pFVar3;
  long lVar4;
  long lVar5;
  EnumGenerator EStack_68;
  
  io::Printer::Print(printer,"// Generated by the protocol buffer compiler.  DO NOT EDIT!\n");
  if ((this->java_package_)._M_string_length != 0) {
    io::Printer::Print(printer,"\npackage $package$;\n","package",&this->java_package_);
  }
  io::Printer::Print(printer,"\n@SuppressWarnings(\"hiding\")\npublic interface $classname$ {\n",
                     "classname",&this->classname_);
  io::Printer::Indent(printer);
  pFVar3 = this->file_;
  if (0 < *(int *)(pFVar3 + 0x88)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      ExtensionGenerator::ExtensionGenerator
                ((ExtensionGenerator *)&EStack_68,
                 (FieldDescriptor *)(*(long *)(pFVar3 + 0x98) + lVar4),this->params_);
      ExtensionGenerator::Generate((ExtensionGenerator *)&EStack_68,printer);
      ExtensionGenerator::~ExtensionGenerator((ExtensionGenerator *)&EStack_68);
      lVar5 = lVar5 + 1;
      pFVar3 = this->file_;
      lVar4 = lVar4 + 0xa8;
    } while (lVar5 < *(int *)(pFVar3 + 0x88));
  }
  if (0 < *(int *)(pFVar3 + 0x68)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      EnumGenerator::EnumGenerator
                (&EStack_68,(EnumDescriptor *)(*(long *)(pFVar3 + 0x70) + lVar4),this->params_);
      EnumGenerator::Generate(&EStack_68,printer);
      EnumGenerator::~EnumGenerator(&EStack_68);
      lVar5 = lVar5 + 1;
      pFVar3 = this->file_;
      lVar4 = lVar4 + 0x38;
    } while (lVar5 < *(int *)(pFVar3 + 0x68));
  }
  pPVar1 = this->params_;
  if (pPVar1->override_java_multiple_files_ != JAVANANO_MUL_TRUE) {
    if (pPVar1->override_java_multiple_files_ != JAVANANO_MUL_FALSE) {
      cVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(pPVar1->java_multiple_files_)._M_t,*(key_type **)pFVar3);
      pFVar3 = this->file_;
      if ((_Rb_tree_header *)cVar2._M_node !=
          &(pPVar1->java_multiple_files_)._M_t._M_impl.super__Rb_tree_header) goto LAB_0027991b;
    }
    if (0 < *(int *)(pFVar3 + 0x58)) {
      lVar4 = 0;
      lVar5 = 0;
      do {
        MessageGenerator::MessageGenerator
                  ((MessageGenerator *)&EStack_68,(Descriptor *)(*(long *)(pFVar3 + 0x60) + lVar4),
                   this->params_);
        MessageGenerator::Generate((MessageGenerator *)&EStack_68,printer);
        MessageGenerator::~MessageGenerator((MessageGenerator *)&EStack_68);
        lVar5 = lVar5 + 1;
        pFVar3 = this->file_;
        lVar4 = lVar4 + 0xa8;
      } while (lVar5 < *(int *)(pFVar3 + 0x58));
    }
  }
LAB_0027991b:
  if (0 < *(int *)(pFVar3 + 0x58)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      MessageGenerator::MessageGenerator
                ((MessageGenerator *)&EStack_68,(Descriptor *)(*(long *)(pFVar3 + 0x60) + lVar4),
                 this->params_);
      MessageGenerator::GenerateStaticVariables((MessageGenerator *)&EStack_68,printer);
      MessageGenerator::~MessageGenerator((MessageGenerator *)&EStack_68);
      lVar5 = lVar5 + 1;
      pFVar3 = this->file_;
      lVar4 = lVar4 + 0xa8;
    } while (lVar5 < *(int *)(pFVar3 + 0x58));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void FileGenerator::Generate(io::Printer* printer) {
  // We don't import anything because we refer to all classes by their
  // fully-qualified names in the generated source.
  printer->Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n");
  if (!java_package_.empty()) {
    printer->Print(
      "\n"
      "package $package$;\n",
      "package", java_package_);
  }

  // Note: constants (from enums, emitted in the loop below) may have the same names as constants
  // in the nested classes. This causes Java warnings, but is not fatal, so we suppress those
  // warnings here in the top-most class declaration.
  printer->Print(
    "\n"
    "@SuppressWarnings(\"hiding\")\n"
    "public interface $classname$ {\n",
    "classname", classname_);
  printer->Indent();

  // -----------------------------------------------------------------

  // Extensions.
  for (int i = 0; i < file_->extension_count(); i++) {
    ExtensionGenerator(file_->extension(i), params_).Generate(printer);
  }

  // Enums.
  for (int i = 0; i < file_->enum_type_count(); i++) {
    EnumGenerator(file_->enum_type(i), params_).Generate(printer);
  }

  // Messages.
  if (!params_.java_multiple_files(file_->name())) {
    for (int i = 0; i < file_->message_type_count(); i++) {
      MessageGenerator(file_->message_type(i), params_).Generate(printer);
    }
  }

  // Static variables.
  for (int i = 0; i < file_->message_type_count(); i++) {
    // TODO(kenton):  Reuse MessageGenerator objects?
    MessageGenerator(file_->message_type(i), params_).GenerateStaticVariables(printer);
  }

  printer->Outdent();
  printer->Print(
    "}\n");
}